

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_update_ghosts_nb(Integer g_a,Integer *nbhandle)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  C_Integer *pCVar5;
  char *pcVar6;
  ushort uVar7;
  Integer proc;
  logical lVar8;
  long lVar9;
  Integer *map;
  ulong *proclist;
  long lVar10;
  size_t sVar11;
  Integer IVar12;
  long lVar13;
  ulong uVar14;
  armci_hdl_t *nb_handle;
  int _d;
  long lVar15;
  long lVar16;
  ushort uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  C_Integer CVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  char *pcVar30;
  ulong proc_00;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  int _index [7];
  Integer _hi [7];
  Integer np;
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar8 = pnga_has_ghosts(g_a);
  if (lVar8 != 0) {
    lVar1 = g_a + 1000;
    iVar2 = GA[lVar1].elemsize;
    lVar19 = (long)GA[lVar1].ndim;
    iVar3 = GA[lVar1].p_handle;
    lVar9 = 0;
    lVar25 = 0;
    if (0 < lVar19) {
      lVar25 = lVar19;
    }
    for (; lVar25 != lVar9; lVar9 = lVar9 + 1) {
      width[lVar9] = GA[g_a + 1000].width[lVar9];
      dims[lVar9] = GA[g_a + 1000].dims[lVar9];
    }
    lVar8 = gai_check_ghost_distr(g_a);
    IVar12 = GAnproc;
    if (lVar8 != 0) {
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_map)",0);
        IVar12 = GAnproc;
      }
      proclist = (ulong *)malloc(IVar12 << 3);
      if (proclist == (ulong *)0x0) {
        pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_proclist)",0);
      }
      ga_init_nbhandle(nbhandle);
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      lVar9 = 1;
      lVar10 = lVar25;
      while (bVar35 = lVar10 != 0, lVar10 = lVar10 + -1, bVar35) {
        lVar9 = lVar9 * 3;
      }
      lVar19 = lVar19 + -1;
      lVar34 = 0;
      lVar10 = lVar19;
      if (lVar19 < 1) {
        lVar10 = lVar34;
      }
      for (lVar31 = 0; lVar31 != lVar9; lVar31 = lVar31 + 1) {
        lVar33 = lVar31;
        lVar15 = 1;
        for (lVar27 = 0; lVar25 != lVar27; lVar27 = lVar27 + 1) {
          lVar20 = lVar33 % 3 + -1;
          mask[lVar27] = lVar20;
          if (lVar20 != 0) {
            lVar15 = lVar34;
          }
          lVar33 = lVar33 / 3;
        }
        if (lVar15 == 0) {
          lVar33 = 0;
          for (lVar15 = 0; lVar25 != lVar15; lVar15 = lVar15 + 1) {
            if ((mask[lVar15] != 0) && (width[lVar15] == 0)) {
              lVar33 = 1;
            }
          }
          if (lVar33 == 0) {
            for (lVar33 = 0; lVar25 != lVar33; lVar33 = lVar33 + 1) {
              lVar15 = mask[lVar33];
              if (lVar15 == -1) {
                lVar15 = lo_loc[lVar33];
                if (1 < lVar15) {
                  tlo_rem[lVar33] = lVar15 - width[lVar33];
                  lVar15 = lVar15 + -1;
                  goto LAB_0017c781;
                }
                thi_rem[lVar33] = dims[lVar33];
                tlo_rem[lVar33] = (dims[lVar33] - width[lVar33]) + 1;
              }
              else {
                if (lVar15 == 1) {
                  lVar15 = hi_loc[lVar33];
                  if (lVar15 < dims[lVar33]) {
                    tlo_rem[lVar33] = lVar15 + 1;
                    lVar15 = lVar15 + width[lVar33];
                  }
                  else {
                    tlo_rem[lVar33] = 1;
                    lVar15 = width[lVar33];
                  }
                }
                else {
                  if (lVar15 != 0) {
                    fwrite("Illegal mask value found\n",0x19,1,_stderr);
                    goto LAB_0017c789;
                  }
                  tlo_rem[lVar33] = lo_loc[lVar33];
                  lVar15 = hi_loc[lVar33];
                }
LAB_0017c781:
                thi_rem[lVar33] = lVar15;
              }
LAB_0017c789:
            }
            lVar8 = pnga_locate_region(g_a,tlo_rem,thi_rem,map,(Integer *)proclist,&np);
            if (lVar8 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar11 = strlen(err_string);
              sprintf(err_string + (int)sVar11," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
              sVar11 = strlen(err_string);
              lVar33 = 1;
              while( true ) {
                IVar12 = pnga_ndim(g_a);
                pcVar30 = err_string + (int)sVar11;
                if (IVar12 <= lVar33) break;
                sprintf(pcVar30,",%ld:%ld ",tlo_rem[lVar33],thi_rem[lVar33]);
                sVar11 = strlen(err_string);
                lVar33 = lVar33 + 1;
              }
              pcVar30[0] = ']';
              pcVar30[1] = '\0';
              pnga_error(err_string,g_a);
            }
            if (1 < np) {
              fwrite("More than one remote processor found\n",0x25,1,_stderr);
            }
            proc_00 = *proclist;
            pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
            for (lVar33 = 0; lVar25 != lVar33; lVar33 = lVar33 + 1) {
              lVar15 = mask[lVar33];
              if (lVar15 == -1) {
                plo_loc[lVar33] = 0;
                phi_loc[lVar33] = width[lVar33] + -1;
                lVar15 = (thi_rem[lVar33] - tlo_rem[lVar33]) + 1;
LAB_0017c9c3:
                plo_rem[lVar33] = lVar15;
              }
              else {
                if (lVar15 == 1) {
                  lVar15 = width[lVar33];
                  plo_loc[lVar33] = lVar15 + (hi_loc[lVar33] - lo_loc[lVar33]) + 1;
                  lVar27 = (hi_loc[lVar33] - lo_loc[lVar33]) + lVar15 * 2;
LAB_0017c98a:
                  phi_loc[lVar33] = lVar27;
                  goto LAB_0017c9c3;
                }
                if (lVar15 == 0) {
                  lVar15 = width[lVar33];
                  plo_loc[lVar33] = lVar15;
                  lVar27 = (hi_loc[lVar33] + lVar15) - lo_loc[lVar33];
                  goto LAB_0017c98a;
                }
              }
            }
            uVar17 = GA[lVar1].ndim;
            lVar33 = (long)(short)uVar17;
            iVar26 = GA[lVar1].distr_type;
            if (iVar26 - 1U < 3) {
              lVar27 = (long)(int)proc % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar27;
              IVar12 = proc;
              lVar15 = 0;
              while (lVar15 + 1 < lVar33) {
                IVar12 = (long)((int)IVar12 - (int)lVar27) / GA[g_a + 1000].num_blocks[lVar15];
                lVar27 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
                _index[lVar15 + 1] = (int)lVar27;
                lVar15 = lVar15 + 1;
              }
              uVar7 = 0;
              if (0 < (short)uVar17) {
                uVar7 = uVar17;
              }
              for (lVar15 = 0; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
                iVar29 = *(int *)((long)_index + lVar15);
                lVar27 = *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2);
                *(long *)(err_string + lVar15 * 2) = lVar27 * iVar29 + 1;
                lVar27 = ((long)iVar29 + 1) * lVar27;
                lVar20 = *(long *)((long)GA[g_a + 1000].dims + lVar15 * 2);
                if (lVar20 <= lVar27) {
                  lVar27 = lVar20;
                }
                *(long *)((long)_hi + lVar15 * 2) = lVar27;
              }
            }
            else if (iVar26 == 4) {
              lVar27 = (long)(int)proc % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar27;
              IVar12 = proc;
              lVar15 = 0;
              while (lVar15 + 1 < lVar33) {
                IVar12 = (long)((int)IVar12 - (int)lVar27) / GA[g_a + 1000].num_blocks[lVar15];
                lVar27 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
                _index[lVar15 + 1] = (int)lVar27;
                lVar15 = lVar15 + 1;
              }
              lVar15 = 0;
              uVar7 = 0;
              if (0 < (short)uVar17) {
                uVar7 = uVar17;
              }
              iVar29 = 0;
              for (; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
                pCVar5 = GA[lVar1].mapc;
                iVar18 = *(int *)((long)_index + lVar15);
                lVar20 = (long)iVar29 + (long)iVar18;
                *(C_Integer *)(err_string + lVar15 * 2) = pCVar5[lVar20];
                lVar27 = *(long *)((long)GA[lVar1].num_blocks + lVar15 * 2);
                if ((long)iVar18 < lVar27 + -1) {
                  lVar20 = pCVar5[lVar20 + 1] + -1;
                }
                else {
                  lVar20 = *(long *)((long)GA[lVar1].dims + lVar15 * 2);
                }
                *(long *)((long)_hi + lVar15 * 2) = lVar20;
                iVar29 = iVar29 + (int)lVar27;
              }
            }
            else if (iVar26 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar15 = 0;
                if (0 < lVar33) {
                  lVar15 = lVar33;
                }
                lVar27 = 1;
                for (lVar20 = 0; lVar15 != lVar20; lVar20 = lVar20 + 1) {
                  lVar27 = lVar27 * GA[g_a + 1000].nblock[lVar20];
                }
                if ((proc < 0) || (lVar27 <= proc)) {
                  for (lVar27 = 0; lVar15 != lVar27; lVar27 = lVar27 + 1) {
                    hi_loc[lVar27 + -0x20] = 0;
                    _hi[lVar27] = -1;
                  }
                }
                else {
                  lVar20 = 0;
                  IVar12 = proc;
                  for (lVar27 = 0; lVar15 != lVar27; lVar27 = lVar27 + 1) {
                    lVar16 = (long)GA[g_a + 1000].nblock[lVar27];
                    lVar13 = IVar12 % lVar16;
                    pCVar5 = GA[lVar1].mapc;
                    hi_loc[lVar27 + -0x20] = pCVar5[lVar13 + lVar20];
                    if (lVar13 == lVar16 + -1) {
                      CVar24 = GA[g_a + 1000].dims[lVar27];
                    }
                    else {
                      CVar24 = pCVar5[lVar13 + lVar20 + 1] + -1;
                    }
                    lVar20 = lVar20 + lVar16;
                    _hi[lVar27] = CVar24;
                    IVar12 = IVar12 / lVar16;
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                lVar15 = 0;
                if (0 < lVar33) {
                  lVar15 = lVar33;
                }
                lVar27 = 1;
                for (lVar20 = 0; lVar15 != lVar20; lVar20 = lVar20 + 1) {
                  lVar27 = lVar27 * GA[g_a + 1000].nblock[lVar20];
                }
                if ((proc < 0) || (lVar27 <= proc)) {
                  for (lVar27 = 0; lVar15 != lVar27; lVar27 = lVar27 + 1) {
                    hi_loc[lVar27 + -0x20] = 0;
                    _hi[lVar27] = -1;
                  }
                }
                else {
                  lVar27 = 0;
                  IVar12 = proc;
                  for (lVar20 = 0; lVar15 != lVar20; lVar20 = lVar20 + 1) {
                    lVar16 = (long)GA[g_a + 1000].nblock[lVar20];
                    lVar13 = IVar12 % lVar16;
                    pCVar5 = GA[lVar1].mapc;
                    hi_loc[lVar20 + -0x20] = pCVar5[lVar13 + lVar27];
                    if (lVar13 == lVar16 + -1) {
                      CVar24 = GA[g_a + 1000].dims[lVar20];
                    }
                    else {
                      CVar24 = pCVar5[lVar13 + lVar27 + 1] + -1;
                    }
                    lVar27 = lVar27 + lVar16;
                    _hi[lVar20] = CVar24;
                    IVar12 = IVar12 / lVar16;
                  }
                }
              }
              else {
                iVar29 = 0;
                if (0 < (short)uVar17) {
                  iVar29 = (int)(short)uVar17;
                }
                for (lVar15 = 0; iVar29 != lVar15; lVar15 = lVar15 + 1) {
                  hi_loc[lVar15 + -0x20] = 0;
                  _hi[lVar15] = -1;
                }
              }
            }
            lVar15 = lVar33 + -1;
            if (lVar15 == 0) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar27 = 0;
            if (0 < lVar15) {
              lVar27 = lVar15;
            }
            lVar13 = 0;
            lVar20 = 1;
            for (lVar16 = 0; lVar27 != lVar16; lVar16 = lVar16 + 1) {
              lVar13 = lVar13 + plo_loc[lVar16] * lVar20;
              lVar21 = (_hi[lVar16] - hi_loc[lVar16 + -0x20]) + GA[g_a + 1000].width[lVar16] * 2 + 1
              ;
              ld_loc[lVar16] = lVar21;
              lVar20 = lVar20 * lVar21;
            }
            lVar16 = *(long *)(stride_loc + lVar33 * 2 + 6);
            ppcVar4 = GA[lVar1].ptr;
            iVar29 = GA[lVar1].elemsize;
            pcVar30 = ppcVar4[proc];
            if (iVar26 - 1U < 3) {
              lVar22 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar22;
              uVar14 = proc_00;
              lVar21 = 0;
              while (lVar21 + 1 < lVar33) {
                uVar14 = (long)((int)uVar14 - (int)lVar22) / GA[g_a + 1000].num_blocks[lVar21];
                lVar22 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar21 + 1];
                _index[lVar21 + 1] = (int)lVar22;
                lVar21 = lVar21 + 1;
              }
              uVar7 = 0;
              if (0 < (short)uVar17) {
                uVar7 = uVar17;
              }
              for (lVar21 = 0; (ulong)uVar7 * 4 != lVar21; lVar21 = lVar21 + 4) {
                iVar26 = *(int *)((long)_index + lVar21);
                lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar21 * 2);
                *(long *)(err_string + lVar21 * 2) = lVar22 * iVar26 + 1;
                lVar22 = ((long)iVar26 + 1) * lVar22;
                lVar28 = *(long *)((long)GA[g_a + 1000].dims + lVar21 * 2);
                if (lVar28 <= lVar22) {
                  lVar22 = lVar28;
                }
                *(long *)((long)_hi + lVar21 * 2) = lVar22;
              }
            }
            else if (iVar26 == 4) {
              lVar22 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar22;
              uVar14 = proc_00;
              lVar21 = 0;
              while (lVar21 + 1 < lVar33) {
                uVar14 = (long)((int)uVar14 - (int)lVar22) / GA[g_a + 1000].num_blocks[lVar21];
                lVar22 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar21 + 1];
                _index[lVar21 + 1] = (int)lVar22;
                lVar21 = lVar21 + 1;
              }
              lVar21 = 0;
              if ((short)uVar17 < 1) {
                uVar17 = 0;
              }
              iVar26 = 0;
              for (; (ulong)uVar17 * 4 != lVar21; lVar21 = lVar21 + 4) {
                pCVar5 = GA[lVar1].mapc;
                iVar18 = *(int *)((long)_index + lVar21);
                lVar28 = (long)iVar26 + (long)iVar18;
                *(C_Integer *)(err_string + lVar21 * 2) = pCVar5[lVar28];
                lVar22 = *(long *)((long)GA[lVar1].num_blocks + lVar21 * 2);
                if ((long)iVar18 < lVar22 + -1) {
                  lVar28 = pCVar5[lVar28 + 1] + -1;
                }
                else {
                  lVar28 = *(long *)((long)GA[lVar1].dims + lVar21 * 2);
                }
                *(long *)((long)_hi + lVar21 * 2) = lVar28;
                iVar26 = iVar26 + (int)lVar22;
              }
            }
            else if (iVar26 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar21 = lVar33;
                if (lVar33 < 1) {
                  lVar21 = lVar34;
                }
                lVar22 = 1;
                for (lVar28 = 0; lVar21 != lVar28; lVar28 = lVar28 + 1) {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[lVar28];
                }
                if (((long)proc_00 < 0) || (lVar22 <= (long)proc_00)) {
                  for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
                    hi_loc[lVar22 + -0x20] = 0;
                    _hi[lVar22] = -1;
                  }
                }
                else {
                  lVar28 = 0;
                  uVar14 = proc_00;
                  for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
                    lVar32 = (long)GA[g_a + 1000].nblock[lVar22];
                    lVar23 = (long)uVar14 % lVar32;
                    pCVar5 = GA[lVar1].mapc;
                    hi_loc[lVar22 + -0x20] = pCVar5[lVar23 + lVar28];
                    if (lVar23 == lVar32 + -1) {
                      CVar24 = GA[g_a + 1000].dims[lVar22];
                    }
                    else {
                      CVar24 = pCVar5[lVar23 + lVar28 + 1] + -1;
                    }
                    lVar28 = lVar28 + lVar32;
                    _hi[lVar22] = CVar24;
                    uVar14 = (long)uVar14 / lVar32;
                  }
                }
              }
              else if ((long)proc_00 < GA[lVar1].num_rstrctd) {
                lVar21 = lVar33;
                if (lVar33 < 1) {
                  lVar21 = lVar34;
                }
                lVar22 = 1;
                for (lVar28 = 0; lVar21 != lVar28; lVar28 = lVar28 + 1) {
                  lVar22 = lVar22 * GA[g_a + 1000].nblock[lVar28];
                }
                if (((long)proc_00 < 0) || (lVar22 <= (long)proc_00)) {
                  for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
                    hi_loc[lVar22 + -0x20] = 0;
                    _hi[lVar22] = -1;
                  }
                }
                else {
                  lVar28 = 0;
                  uVar14 = proc_00;
                  for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
                    lVar32 = (long)GA[g_a + 1000].nblock[lVar22];
                    lVar23 = (long)uVar14 % lVar32;
                    pCVar5 = GA[lVar1].mapc;
                    hi_loc[lVar22 + -0x20] = pCVar5[lVar23 + lVar28];
                    if (lVar23 == lVar32 + -1) {
                      CVar24 = GA[g_a + 1000].dims[lVar22];
                    }
                    else {
                      CVar24 = pCVar5[lVar23 + lVar28 + 1] + -1;
                    }
                    lVar28 = lVar28 + lVar32;
                    _hi[lVar22] = CVar24;
                    uVar14 = (long)uVar14 / lVar32;
                  }
                }
              }
              else {
                iVar26 = 0;
                if (0 < (short)uVar17) {
                  iVar26 = (int)(short)uVar17;
                }
                for (lVar21 = 0; iVar26 != lVar21; lVar21 = lVar21 + 1) {
                  hi_loc[lVar21 + -0x20] = 0;
                  _hi[lVar21] = -1;
                }
              }
            }
            if (lVar15 == 0) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar15 = 1;
            lVar21 = 0;
            for (lVar22 = 0; lVar27 != lVar22; lVar22 = lVar22 + 1) {
              lVar21 = lVar21 + plo_rem[lVar22] * lVar15;
              lVar28 = (_hi[lVar22] - hi_loc[lVar22 + -0x20]) + GA[g_a + 1000].width[lVar22] * 2 + 1
              ;
              ld_rem[lVar22] = lVar28;
              lVar15 = lVar15 * lVar28;
            }
            lVar33 = plo_rem[lVar33 + -1];
            pcVar6 = ppcVar4[proc_00];
            stride_loc[0] = iVar2;
            stride_rem[0] = iVar2;
            iVar26 = iVar2;
            iVar18 = iVar2;
            for (lVar27 = 0; lVar10 << 2 != lVar27; lVar27 = lVar27 + 4) {
              iVar26 = iVar26 * *(int *)((long)ld_rem + lVar27 * 2);
              *(int *)((long)stride_rem + lVar27) = iVar26;
              iVar18 = iVar18 * *(int *)((long)ld_loc + lVar27 * 2);
              *(int *)((long)stride_loc + lVar27) = iVar18;
              *(int *)((long)stride_rem + lVar27 + 4) = iVar26;
              *(int *)((long)stride_loc + lVar27 + 4) = iVar18;
            }
            for (lVar27 = 0; lVar25 != lVar27; lVar27 = lVar27 + 1) {
              count[lVar27] = ((int)phi_loc[lVar27] - (int)plo_loc[lVar27]) + 1;
            }
            count[0] = count[0] * iVar2;
            if (-1 < iVar3) {
              proc_00 = (ulong)(uint)PGRP_LIST[iVar3].inv_map_proc_list[proc_00];
            }
            nb_handle = get_armci_nbhandle(nbhandle);
            ARMCI_NbGetS(pcVar6 + (lVar15 * lVar33 + lVar21) * (long)iVar29,stride_rem,
                         pcVar30 + (lVar20 * lVar16 + lVar13) * (long)iVar29,stride_loc,count,
                         (int)lVar19,(int)proc_00,nb_handle);
          }
        }
      }
      free(map);
      free(proclist);
    }
  }
  return;
}

Assistant:

void pnga_update_ghosts_nb(Integer g_a, Integer *nbhandle)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  /*Integer tlo_loc[MAXDIM], thi_loc[MAXDIM];*/
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return;
  }

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_proclist)",0);

  /* Create non-blocking handle */
  ga_init_nbhandle(nbhandle);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of PUT operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all GET operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor to which it is going. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor from which data must be retrieved */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_NbGetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
        (int)(ndim - 1), (int)proc_rem, 
        (armci_hdl_t*)get_armci_nbhandle(nbhandle));
  }

  free(_ga_map);
  free(_ga_proclist);
  return;
}